

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterInfo.cpp
# Opt level: O3

void __thiscall helics::FilterInfo::removeTarget(FilterInfo *this,GlobalHandle targetId)

{
  iterator __position;
  pointer pGVar1;
  pointer pEVar2;
  EptInformation *dim;
  pointer pEVar3;
  EptInformation *sim;
  
  __position._M_current =
       (this->sourceEndpoints).
       super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>._M_impl.
       super__Vector_impl_data._M_start;
  if (__position._M_current !=
      (this->sourceEndpoints).
      super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>::_M_erase
              (&this->sourceEndpoints,__position);
    pGVar1 = (this->sourceTargets).
             super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((this->sourceTargets).
        super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
        super__Vector_impl_data._M_finish != pGVar1) {
      (this->sourceTargets).
      super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
      super__Vector_impl_data._M_finish = pGVar1;
    }
    pEVar3 = (this->sourceEndpoints).
             super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pEVar2 = (this->sourceEndpoints).
             super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pEVar3 != pEVar2) {
      do {
        std::vector<helics::GlobalHandle,std::allocator<helics::GlobalHandle>>::
        emplace_back<helics::GlobalHandle_const&>
                  ((vector<helics::GlobalHandle,std::allocator<helics::GlobalHandle>> *)
                   &this->sourceTargets,&pEVar3->id);
        pEVar3 = pEVar3 + 1;
      } while (pEVar3 != pEVar2);
    }
    (this->sourceEpts)._M_string_length = 0;
    *(this->sourceEpts)._M_dataplus._M_p = '\0';
  }
  if ((this->destEndpoints).
      super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->destEndpoints).
      super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>::_M_erase
              (&this->destEndpoints,__position);
    pGVar1 = (this->destTargets).
             super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((this->destTargets).
        super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
        super__Vector_impl_data._M_finish != pGVar1) {
      (this->destTargets).
      super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
      super__Vector_impl_data._M_finish = pGVar1;
    }
    pEVar3 = (this->destEndpoints).
             super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pEVar2 = (this->destEndpoints).
             super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pEVar3 != pEVar2) {
      do {
        std::vector<helics::GlobalHandle,std::allocator<helics::GlobalHandle>>::
        emplace_back<helics::GlobalHandle_const&>
                  ((vector<helics::GlobalHandle,std::allocator<helics::GlobalHandle>> *)
                   &this->destTargets,&pEVar3->id);
        pEVar3 = pEVar3 + 1;
      } while (pEVar3 != pEVar2);
    }
    (this->destEpts)._M_string_length = 0;
    *(this->destEpts)._M_dataplus._M_p = '\0';
  }
  return;
}

Assistant:

void FilterInfo::removeTarget(GlobalHandle targetId)
{
    auto si = sourceEndpoints.begin();
    while (si != sourceEndpoints.end()) {
        if (si->id == targetId) {
            sourceEndpoints.erase(si);
            sourceTargets.clear();
            for (const auto& sim : sourceEndpoints) {
                sourceTargets.emplace_back(sim.id);
            }
            sourceEpts.clear();
            break;
        }
    }
    auto di = destEndpoints.begin();
    while (di != destEndpoints.end()) {
        if (di->id == targetId) {
            destEndpoints.erase(si);
            destTargets.clear();
            for (const auto& dim : destEndpoints) {
                destTargets.emplace_back(dim.id);
            }
            destEpts.clear();
            break;
        }
    }
}